

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::
         ClassNamePrefix<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,string *classname,EnumDescriptor *desc)

{
  FileDescriptor *pFVar1;
  FileOptions *this;
  string *psVar2;
  ulong uVar3;
  string *prefix;
  EnumDescriptor *desc_local;
  string *classname_local;
  
  pFVar1 = EnumDescriptor::file(desc);
  this = FileDescriptor::options(pFVar1);
  psVar2 = FileOptions::php_class_prefix_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    pFVar1 = EnumDescriptor::file(desc);
    ReservedNamePrefix(__return_storage_ptr__,classname,pFVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNamePrefix(const std::string& classname,
                            const DescriptorType* desc) {
  const std::string& prefix = (desc->file()->options()).php_class_prefix();
  if (!prefix.empty()) {
    return prefix;
  }

  return ReservedNamePrefix(classname, desc->file());
}